

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxseparate.cpp
# Opt level: O3

void save_vox_scene(char *pcFilename,ogt_vox_scene *scene)

{
  uint in_EAX;
  uint8_t *__ptr;
  FILE *__s;
  uint32_t buffersize;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  __ptr = ogt_vox_write_scene(scene,(uint32_t *)((long)&uStack_18 + 4));
  if (__ptr != (uint8_t *)0x0) {
    __s = fopen(pcFilename,"wb");
    if (__s != (FILE *)0x0) {
      fwrite(__ptr,uStack_18 >> 0x20,1,__s);
      fclose(__s);
    }
    (*g_free_func)(__ptr);
    return;
  }
  return;
}

Assistant:

void save_vox_scene(const char* pcFilename, const ogt_vox_scene* scene)
{
    // save the scene back out.
    uint32_t buffersize = 0;
    uint8_t* buffer = ogt_vox_write_scene(scene, &buffersize);
    if (!buffer)
        return;

    // open the file for write
    FILE * fp = open_file(pcFilename, "wb");
    if (!fp) {
        ogt_vox_free(buffer);
        return;
    }

    fwrite(buffer, buffersize, 1, fp);
    fclose(fp);
    ogt_vox_free(buffer);
}